

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmik.cpp
# Opt level: O3

void __thiscall lmik::solve(lmik *this,Vector2d *q_ref,Vector2d *X_ref)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator_1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  SrcEvaluatorType srcEvaluator;
  Vector2d g;
  Matrix2d H;
  assign_op<double,_double> local_179;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Vector2d *local_120;
  SrcXprType local_118;
  double *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Matrix<double,_2,_2,_0,_2,_2> local_b8;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  Matrix<double,_2,_2,_0,_2,_2> local_78 [2];
  
  dVar2 = (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[0];
  dVar3 = (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  local_120 = q_ref;
  do {
    local_178._8_4_ = SUB84(dVar3,0);
    local_178._0_8_ = dVar2;
    local_178._12_4_ = (int)((ulong)dVar3 >> 0x20);
    local_138._8_8_ = 0;
    local_138._0_8_ =
         (X_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
         array[0];
    dVar2 = cos(dVar2);
    dVar3 = local_178._8_8_ + (double)local_178._0_8_;
    local_148._8_4_ = local_178._8_4_;
    local_148._0_8_ = dVar3;
    local_148._12_4_ = local_178._12_4_;
    local_158._0_8_ = dVar2;
    dVar2 = cos(dVar3);
    uVar4 = local_138._12_4_;
    local_138._8_4_ = local_138._8_4_;
    local_138._0_8_ = local_138._0_8_ - ((double)local_158._0_8_ * 0.1 + dVar2 * 0.1);
    local_138._12_4_ = uVar4;
    local_158._8_8_ = 0;
    local_158._0_8_ =
         (X_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
         array[1];
    dVar2 = sin((double)local_178._0_8_);
    local_168._0_8_ = dVar2;
    dVar2 = sin((double)local_148._0_8_);
    uVar4 = local_158._12_4_;
    dStack_d0 = local_158._0_8_ - ((double)local_168._0_8_ * 0.1 + dVar2 * 0.1);
    local_158._8_4_ = local_158._8_4_;
    local_158._0_8_ = dStack_d0;
    local_158._12_4_ = uVar4;
    local_d8 = (double)local_138._0_8_;
    dVar2 = sin((double)local_178._0_8_);
    local_168._8_4_ = extraout_XMM0_Dc;
    local_168._0_8_ = dVar2;
    local_168._12_4_ = extraout_XMM0_Dd;
    dVar2 = sin((double)local_148._0_8_);
    local_f8._8_4_ = extraout_XMM0_Dc_00;
    local_f8._0_8_ = dVar2;
    local_f8._12_4_ = extraout_XMM0_Dd_00;
    dVar2 = sin((double)local_148._0_8_);
    local_e8._8_4_ = extraout_XMM0_Dc_01;
    local_e8._0_8_ = dVar2;
    local_e8._12_4_ = extraout_XMM0_Dd_01;
    dVar2 = cos((double)local_178._0_8_);
    local_108._8_4_ = extraout_XMM0_Dc_02;
    local_108._0_8_ = dVar2;
    local_108._12_4_ = extraout_XMM0_Dd_02;
    dVar2 = cos((double)local_148._0_8_);
    dVar3 = (double)local_168._0_8_ * -0.1 + (double)local_f8._0_8_ * -0.1;
    dVar2 = (double)local_108._0_8_ * 0.1 + dVar2 * 0.1;
    uVar4 = SUB84(dVar2,0);
    uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
    local_168._8_4_ = uVar4;
    local_168._0_8_ = dVar3;
    local_168._12_4_ = uVar5;
    local_98._8_4_ = uVar4;
    local_98._0_8_ = dVar3;
    local_98._12_4_ = uVar5;
    dStack_80 = cos((double)local_148._0_8_);
    local_88 = (double)local_e8._0_8_ * -0.1;
    dStack_80 = dStack_80 * 0.1;
    dVar2 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[0];
    dVar3 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1];
    dVar8 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[2];
    dVar9 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[3];
    dVar6 = (double)local_168._8_8_ * dVar3 + (double)local_168._0_8_ * dVar2;
    dVar7 = dVar3 * dStack_80 + dVar2 * local_88;
    dVar2 = (double)local_168._8_8_ * dVar9 + (double)local_168._0_8_ * dVar8;
    dVar3 = dVar9 * dStack_80 + dVar8 * local_88;
    local_c8 = (double)local_158._0_8_ * dVar2 + (double)local_138._0_8_ * dVar6;
    dStack_c0 = (double)local_158._0_8_ * dVar3 + (double)local_138._0_8_ * dVar7;
    dVar8 = dStack_d0 * dStack_d0 + local_d8 * local_d8;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = (double)local_98._8_8_ * dVar2 + (double)local_168._0_8_ * dVar6 +
           dVar8 + (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                   m_storage.m_data.array[0];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
         = (double)local_98._8_8_ * dVar3 + (double)local_168._0_8_ * dVar7 +
           dVar8 * 0.0 +
           (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[1];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = dStack_80 * dVar2 + local_88 * dVar6 +
           dVar8 * 0.0 +
           (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[2];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = dStack_80 * dVar3 + local_88 * dVar7 +
           dVar8 + (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                   m_storage.m_data.array[3];
    local_118.m_xpr = &local_b8;
    local_110 = &local_c8;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_78,&local_118,&local_179);
    dVar8 = local_110[1] *
            local_78[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[2] +
            *local_110 *
            local_78[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[0];
    dVar9 = local_110[1] *
            local_78[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[3] +
            *local_110 *
            local_78[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1];
    dVar2 = (double)local_178._0_8_ + dVar8;
    dVar3 = (double)local_178._8_8_ + dVar9;
    if (ABS(dVar8) <= this->threshold) break;
  } while (this->threshold < ABS(dVar9));
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  *(undefined1 (*) [16])
   (local_120->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
       = auVar1;
  return;
}

Assistant:

void lmik::solve(Vector2d& q_ref, const Vector2d& X_ref) {
    Matrix2d W_N, J, H;
    Vector2d q, q_new, delta_q, e, g; 
    q = q_ref;
    
    do {
        cal_e(e, q, X_ref);
        cal_J(J, q);
        cal_g(g, J, e);
        cal_W_N(W_N, e);
        cal_H(H, J, W_N);
        delta_q = H.inverse() * g;
        q += delta_q;
    } while(abs(delta_q(0)) > threshold && abs(delta_q(1)) > threshold);

    q_ref = q;
    return;
}